

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O2

void __thiscall PythonModuleClient::recv_time(PythonModuleClient *this,uint32_t time)

{
  bool_type bVar1;
  override recv_time;
  PyLockGIL lock;
  object_base local_20;
  PyLockGIL local_18;
  uint32_t local_14;
  handle<_object> local_10;
  
  local_14 = time;
  local_18.gstate = PyGILState_Ensure();
  boost::python::wrapper<AbstractModuleClient>::get_override
            ((wrapper<AbstractModuleClient> *)&local_20,
             (char *)&this->super_wrapper<AbstractModuleClient>);
  bVar1 = boost::python::api::object_operators::operator_cast_to_function_pointer
                    ((object_operators *)&local_20);
  if (bVar1 != 0) {
    boost::python::override::operator()((override *)&local_10,(uint *)&local_20);
    boost::python::handle<_object>::~handle(&local_10);
  }
  boost::python::api::object_base::~object_base(&local_20);
  PyLockGIL::~PyLockGIL(&local_18);
  return;
}

Assistant:

void recv_time(uint32_t time){
        PyLockGIL lock;
        if(override recv_time = this->get_override("recv_time")){
            try{
                recv_time(time);
            }
            catch (const error_already_set&){
                std::cout << "Exception in recv_time in application";
                PyErr_Print();
            }
            return;
        }
        AbstractModuleClient::recv_time(time);
    }